

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::RepeatedField_ArenaAllocationSizesMatchExpectedValues_Test::
TestBody(RepeatedField_ArenaAllocationSizesMatchExpectedValues_Test *this)

{
  long lVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  void *pvVar5;
  RepeatedField<bool> *this_00;
  uint64_t uVar6;
  uint64_t uVar7;
  RepeatedField<unsigned_int> *this_01;
  RepeatedField<unsigned_long> *this_02;
  ShortSooRep *this_03;
  byte bVar8;
  int iVar9;
  char *pcVar10;
  size_t last_alloc_3;
  AssertionResult gtest_ar;
  size_t last_alloc;
  string buf;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  Arena arena;
  AssertHelper local_148;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_140;
  undefined1 local_138 [16];
  ulong local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_120;
  AssertHelper local_118;
  AssertHelper local_110;
  size_t local_108;
  undefined1 local_100 [24];
  char local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8 [10];
  
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)(local_100 + 0x10));
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      local_110.data_ = (AssertHelperData *)local_100;
      std::__cxx11::string::_M_construct((ulong)&local_110,'\0');
      protobuf::internal::ThreadSafeArena::ThreadSafeArena
                ((ThreadSafeArena *)local_d8,(char *)local_110.data_,local_108);
      pvVar5 = Arena::Allocate((Arena *)local_d8,0x10);
      local_138._0_8_ = local_d8;
      this_00 = Arena::InternalHelper<google::protobuf::RepeatedField<bool>>::
                Construct<google::protobuf::Arena*>(pvVar5,(Arena **)local_138);
      uVar6 = protobuf::internal::ThreadSafeArena::SpaceUsed((ThreadSafeArena *)local_d8);
      iVar9 = 100;
      do {
        RepeatedField<bool>::Add(this_00,false);
        uVar7 = protobuf::internal::ThreadSafeArena::SpaceUsed((ThreadSafeArena *)local_d8);
        local_128 = uVar7 - uVar6;
        if (local_128 != 0) {
          local_140._M_head_impl._0_4_ = 0x10;
          testing::internal::CmpHelperGE<unsigned_long,int>
                    ((internal *)local_138,"last_alloc","16",&local_128,(int *)&local_140);
          if ((internal)local_138[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_140);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138._8_8_
                == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar10 = anon_var_dwarf_a12c75 + 5;
            }
            else {
              pcVar10 = ((_Alloc_hider *)local_138._8_8_)->_M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_148,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
                       ,200,pcVar10);
            testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_140);
          }
          else {
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138._8_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)(local_138 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_138._8_8_);
            }
            if (local_128 == 0) {
              bVar8 = 0;
            }
            else {
              lVar1 = 0x3f;
              if (local_128 != 0) {
                for (; local_128 >> lVar1 == 0; lVar1 = lVar1 + -1) {
                }
              }
              bVar8 = (byte)lVar1 ^ 0x3f;
            }
            local_140._M_head_impl._0_4_ = 1 << (~bVar8 & 0x1f);
            testing::internal::CmpHelperEQ<int,unsigned_long>
                      ((internal *)local_138,"(1 << log2)","last_alloc",(int *)&local_140,&local_128
                      );
            if ((internal)local_138[0] != (internal)0x0) {
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_138._8_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)(local_138 + 8),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_138._8_8_);
              }
              goto LAB_0092521f;
            }
            testing::Message::Message((Message *)&local_140);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138._8_8_
                == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar10 = anon_var_dwarf_a12c75 + 5;
            }
            else {
              pcVar10 = ((_Alloc_hider *)local_138._8_8_)->_M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_148,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
                       ,0xcb,pcVar10);
            testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_140);
          }
LAB_0092535c:
          testing::internal::AssertHelper::~AssertHelper(&local_148);
          if (local_140._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_140._M_head_impl + 8))();
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138._8_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)(local_138 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_138._8_8_);
          }
          break;
        }
LAB_0092521f:
        iVar4 = 3;
        if ((undefined1  [16])
            ((undefined1  [16])(this_00->soo_rep_).field_0 & (undefined1  [16])0x4) !=
            (undefined1  [16])0x0) {
          iVar4 = (this_00->soo_rep_).field_0.long_rep.capacity;
        }
        if (8 < iVar4) {
          local_140._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (CONCAT44(local_140._M_head_impl._4_4_,iVar4) & 0xffffffff00000007);
          local_148.data_._0_4_ = 0;
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)local_138,"capacity_bytes % 8","0",(int *)&local_140,
                     (int *)&local_148);
          if ((internal)local_138[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_140);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138._8_8_
                == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar10 = anon_var_dwarf_a12c75 + 5;
            }
            else {
              pcVar10 = ((_Alloc_hider *)local_138._8_8_)->_M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_148,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
                       ,0xd1,pcVar10);
            testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_140);
            goto LAB_0092535c;
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138._8_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)(local_138 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_138._8_8_);
          }
        }
        iVar9 = iVar9 + -1;
        uVar6 = uVar7;
      } while (iVar9 != 0);
      protobuf::internal::ThreadSafeArena::~ThreadSafeArena((ThreadSafeArena *)local_d8);
      if (local_110.data_ != (AssertHelperData *)local_100) {
        operator_delete(local_110.data_,local_100._0_8_ + 1);
      }
    }
    cVar2 = local_e8;
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)(local_100 + 0x10));
    if (cVar2 == '\x01') goto LAB_009253c0;
  }
  else {
LAB_009253c0:
    testing::Message::Message((Message *)&local_d8[0]._M_allocated_capacity);
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
               ,0xde,
               "Expected: CheckAllocationSizes<RepeatedField<bool>>() doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
              );
    testing::internal::AssertHelper::operator=
              (&local_110,(Message *)&local_d8[0]._M_allocated_capacity);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((long *)local_d8[0]._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_d8[0]._0_8_ + 8))();
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)(local_100 + 0x10));
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      local_110.data_ = (AssertHelperData *)local_100;
      std::__cxx11::string::_M_construct((ulong)&local_110,'\0');
      protobuf::internal::ThreadSafeArena::ThreadSafeArena
                ((ThreadSafeArena *)local_d8,(char *)local_110.data_,local_108);
      pvVar5 = Arena::Allocate((Arena *)local_d8,0x10);
      local_138._0_8_ = local_d8;
      this_01 = Arena::InternalHelper<google::protobuf::RepeatedField<unsigned_int>>::
                Construct<google::protobuf::Arena*>(pvVar5,(Arena **)local_138);
      uVar6 = protobuf::internal::ThreadSafeArena::SpaceUsed((ThreadSafeArena *)local_d8);
      iVar9 = 100;
      do {
        RepeatedField<unsigned_int>::Add(this_01,0);
        uVar7 = protobuf::internal::ThreadSafeArena::SpaceUsed((ThreadSafeArena *)local_d8);
        local_128 = uVar7 - uVar6;
        if (local_128 != 0) {
          local_140._M_head_impl._0_4_ = 0x10;
          testing::internal::CmpHelperGE<unsigned_long,int>
                    ((internal *)local_138,"last_alloc","16",&local_128,(int *)&local_140);
          if ((internal)local_138[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_140);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138._8_8_
                == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar10 = anon_var_dwarf_a12c75 + 5;
            }
            else {
              pcVar10 = ((_Alloc_hider *)local_138._8_8_)->_M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_148,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
                       ,200,pcVar10);
            testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_140);
          }
          else {
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138._8_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)(local_138 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_138._8_8_);
            }
            if (local_128 == 0) {
              bVar8 = 0;
            }
            else {
              lVar1 = 0x3f;
              if (local_128 != 0) {
                for (; local_128 >> lVar1 == 0; lVar1 = lVar1 + -1) {
                }
              }
              bVar8 = (byte)lVar1 ^ 0x3f;
            }
            local_140._M_head_impl._0_4_ = 1 << (~bVar8 & 0x1f);
            testing::internal::CmpHelperEQ<int,unsigned_long>
                      ((internal *)local_138,"(1 << log2)","last_alloc",(int *)&local_140,&local_128
                      );
            if ((internal)local_138[0] != (internal)0x0) {
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_138._8_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)(local_138 + 8),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_138._8_8_);
              }
              goto LAB_00925575;
            }
            testing::Message::Message((Message *)&local_140);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138._8_8_
                == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar10 = anon_var_dwarf_a12c75 + 5;
            }
            else {
              pcVar10 = ((_Alloc_hider *)local_138._8_8_)->_M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_148,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
                       ,0xcb,pcVar10);
            testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_140);
          }
LAB_009256b6:
          testing::internal::AssertHelper::~AssertHelper(&local_148);
          if (local_140._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_140._M_head_impl + 8))();
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138._8_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)(local_138 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_138._8_8_);
          }
          break;
        }
LAB_00925575:
        iVar4 = (this_01->soo_rep_).field_0.long_rep.capacity << 2;
        if ((undefined1  [16])
            ((undefined1  [16])(this_01->soo_rep_).field_0 & (undefined1  [16])0x4) ==
            (undefined1  [16])0x0) {
          iVar4 = 8;
        }
        if (8 < iVar4) {
          local_140._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (CONCAT44(local_140._M_head_impl._4_4_,iVar4) & 0xffffffff00000004);
          local_148.data_._0_4_ = 0;
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)local_138,"capacity_bytes % 8","0",(int *)&local_140,
                     (int *)&local_148);
          if ((internal)local_138[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_140);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138._8_8_
                == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar10 = anon_var_dwarf_a12c75 + 5;
            }
            else {
              pcVar10 = ((_Alloc_hider *)local_138._8_8_)->_M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_148,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
                       ,0xd1,pcVar10);
            testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_140);
            goto LAB_009256b6;
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138._8_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)(local_138 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_138._8_8_);
          }
        }
        iVar9 = iVar9 + -1;
        uVar6 = uVar7;
      } while (iVar9 != 0);
      protobuf::internal::ThreadSafeArena::~ThreadSafeArena((ThreadSafeArena *)local_d8);
      if (local_110.data_ != (AssertHelperData *)local_100) {
        operator_delete(local_110.data_,local_100._0_8_ + 1);
      }
    }
    cVar2 = local_e8;
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)(local_100 + 0x10));
    if (cVar2 == '\x01') goto LAB_0092571a;
  }
  else {
LAB_0092571a:
    testing::Message::Message((Message *)&local_d8[0]._M_allocated_capacity);
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
               ,0xdf,
               "Expected: CheckAllocationSizes<RepeatedField<uint32_t>>() doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
              );
    testing::internal::AssertHelper::operator=
              (&local_110,(Message *)&local_d8[0]._M_allocated_capacity);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    if ((long *)local_d8[0]._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_d8[0]._0_8_ + 8))();
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)(local_100 + 0x10));
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      local_110.data_ = (AssertHelperData *)local_100;
      std::__cxx11::string::_M_construct((ulong)&local_110,'\0');
      protobuf::internal::ThreadSafeArena::ThreadSafeArena
                ((ThreadSafeArena *)local_d8,(char *)local_110.data_,local_108);
      pvVar5 = Arena::Allocate((Arena *)local_d8,0x10);
      local_138._0_8_ = local_d8;
      this_02 = Arena::InternalHelper<google::protobuf::RepeatedField<unsigned_long>>::
                Construct<google::protobuf::Arena*>(pvVar5,(Arena **)local_138);
      uVar6 = protobuf::internal::ThreadSafeArena::SpaceUsed((ThreadSafeArena *)local_d8);
      iVar9 = 100;
      do {
        RepeatedField<unsigned_long>::Add(this_02,0);
        uVar7 = protobuf::internal::ThreadSafeArena::SpaceUsed((ThreadSafeArena *)local_d8);
        local_128 = uVar7 - uVar6;
        if (local_128 != 0) {
          local_140._M_head_impl._0_4_ = 0x10;
          testing::internal::CmpHelperGE<unsigned_long,int>
                    ((internal *)local_138,"last_alloc","16",&local_128,(int *)&local_140);
          if ((internal)local_138[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_140);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138._8_8_
                == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar10 = anon_var_dwarf_a12c75 + 5;
            }
            else {
              pcVar10 = ((_Alloc_hider *)local_138._8_8_)->_M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_148,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
                       ,200,pcVar10);
            testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_140);
          }
          else {
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138._8_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)(local_138 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_138._8_8_);
            }
            if (local_128 == 0) {
              bVar8 = 0;
            }
            else {
              lVar1 = 0x3f;
              if (local_128 != 0) {
                for (; local_128 >> lVar1 == 0; lVar1 = lVar1 + -1) {
                }
              }
              bVar8 = (byte)lVar1 ^ 0x3f;
            }
            local_140._M_head_impl._0_4_ = 1 << (~bVar8 & 0x1f);
            testing::internal::CmpHelperEQ<int,unsigned_long>
                      ((internal *)local_138,"(1 << log2)","last_alloc",(int *)&local_140,&local_128
                      );
            if ((internal)local_138[0] != (internal)0x0) {
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_138._8_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)(local_138 + 8),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_138._8_8_);
              }
              goto LAB_009258cf;
            }
            testing::Message::Message((Message *)&local_140);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138._8_8_
                == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar10 = anon_var_dwarf_a12c75 + 5;
            }
            else {
              pcVar10 = ((_Alloc_hider *)local_138._8_8_)->_M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_148,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
                       ,0xcb,pcVar10);
            testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_140);
          }
LAB_00925a05:
          testing::internal::AssertHelper::~AssertHelper(&local_148);
          if (local_140._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_140._M_head_impl + 8))();
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138._8_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)(local_138 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_138._8_8_);
          }
          break;
        }
LAB_009258cf:
        if (((undefined1  [16])
             ((undefined1  [16])(this_02->soo_rep_).field_0 & (undefined1  [16])0x4) !=
             (undefined1  [16])0x0) && (8 < (this_02->soo_rep_).field_0.long_rep.capacity * 8)) {
          local_140._M_head_impl = local_140._M_head_impl & 0xffffffff00000000;
          local_148.data_._0_4_ = 0;
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)local_138,"capacity_bytes % 8","0",(int *)&local_140,
                     (int *)&local_148);
          if ((internal)local_138[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_140);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138._8_8_
                == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar10 = anon_var_dwarf_a12c75 + 5;
            }
            else {
              pcVar10 = ((_Alloc_hider *)local_138._8_8_)->_M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_148,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
                       ,0xd1,pcVar10);
            testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_140);
            goto LAB_00925a05;
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138._8_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)(local_138 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_138._8_8_);
          }
        }
        iVar9 = iVar9 + -1;
        uVar6 = uVar7;
      } while (iVar9 != 0);
      protobuf::internal::ThreadSafeArena::~ThreadSafeArena((ThreadSafeArena *)local_d8);
      if (local_110.data_ != (AssertHelperData *)local_100) {
        operator_delete(local_110.data_,local_100._0_8_ + 1);
      }
    }
    cVar2 = local_e8;
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)(local_100 + 0x10));
    if (cVar2 != '\x01') goto LAB_00925abe;
  }
  testing::Message::Message((Message *)&local_d8[0]._M_allocated_capacity);
  testing::internal::AssertHelper::AssertHelper
            (&local_110,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
             ,0xe0,
             "Expected: CheckAllocationSizes<RepeatedField<uint64_t>>() doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
            );
  testing::internal::AssertHelper::operator=
            (&local_110,(Message *)&local_d8[0]._M_allocated_capacity);
  testing::internal::AssertHelper::~AssertHelper(&local_110);
  if ((long *)local_d8[0]._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_d8[0]._0_8_ + 8))();
  }
LAB_00925abe:
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)(local_100 + 0x10));
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      local_110.data_ = (AssertHelperData *)local_100;
      std::__cxx11::string::_M_construct((ulong)&local_110,'\0');
      protobuf::internal::ThreadSafeArena::ThreadSafeArena
                ((ThreadSafeArena *)local_d8,(char *)local_110.data_,local_108);
      this_03 = (ShortSooRep *)
                Arena::AllocateAlignedWithCleanup
                          ((Arena *)local_d8,0x10,8,
                           protobuf::internal::cleanup::
                           arena_destruct_object<google::protobuf::RepeatedField<absl::lts_20250127::Cord>>
                          );
      protobuf::internal::ShortSooRep::ShortSooRep(this_03,(Arena *)local_d8);
      uVar6 = protobuf::internal::ThreadSafeArena::SpaceUsed((ThreadSafeArena *)local_d8);
      iVar9 = 100;
      do {
        local_138._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_138._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        RepeatedField<absl::lts_20250127::Cord>::Add
                  ((RepeatedField<absl::lts_20250127::Cord> *)this_03,(Cord *)local_138);
        absl::lts_20250127::Cord::~Cord((Cord *)local_138);
        uVar7 = protobuf::internal::ThreadSafeArena::SpaceUsed((ThreadSafeArena *)local_d8);
        local_140._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (uVar7 - uVar6);
        if (local_140._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          local_148.data_._0_4_ = 0x10;
          testing::internal::CmpHelperGE<unsigned_long,int>
                    ((internal *)&local_128,"last_alloc","16",(unsigned_long *)&local_140,
                     (int *)&local_148);
          if (local_128._0_1_ == (internal)0x0) {
            testing::Message::Message((Message *)&local_148);
            if (local_120 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar10 = anon_var_dwarf_a12c75 + 5;
            }
            else {
              pcVar10 = (local_120->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_118,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
                       ,200,pcVar10);
            testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_148);
          }
          else {
            if (local_120 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_120,local_120);
            }
            if (local_140._M_head_impl ==
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              bVar8 = 0;
            }
            else {
              lVar1 = 0x3f;
              if (local_140._M_head_impl !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                for (; (ulong)local_140._M_head_impl >> lVar1 == 0; lVar1 = lVar1 + -1) {
                }
              }
              bVar8 = (byte)lVar1 ^ 0x3f;
            }
            local_148.data_._0_4_ = 1 << (~bVar8 & 0x1f);
            testing::internal::CmpHelperEQ<int,unsigned_long>
                      ((internal *)&local_128,"(1 << log2)","last_alloc",(int *)&local_148,
                       (unsigned_long *)&local_140);
            if (local_128._0_1_ != (internal)0x0) {
              if (local_120 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_120,local_120);
              }
              goto LAB_00925c36;
            }
            testing::Message::Message((Message *)&local_148);
            if (local_120 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar10 = anon_var_dwarf_a12c75 + 5;
            }
            else {
              pcVar10 = (local_120->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_118,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
                       ,0xcb,pcVar10);
            testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_148);
          }
LAB_00925d71:
          testing::internal::AssertHelper::~AssertHelper(&local_118);
          if ((long *)CONCAT44(local_148.data_._4_4_,(int)local_148.data_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_148.data_._4_4_,(int)local_148.data_) + 8))();
          }
          if (local_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_120,local_120);
          }
          break;
        }
LAB_00925c36:
        if (((this_03->arena_and_size & 4) != 0) &&
           (8 < *(int *)((long)&this_03->field_1 + 4) * 0x10)) {
          local_148.data_._0_4_ = 0;
          local_118.data_._0_4_ = 0;
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&local_128,"capacity_bytes % 8","0",(int *)&local_148,
                     (int *)&local_118);
          if (local_128._0_1_ == (internal)0x0) {
            testing::Message::Message((Message *)&local_148);
            if (local_120 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar10 = anon_var_dwarf_a12c75 + 5;
            }
            else {
              pcVar10 = (local_120->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_118,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
                       ,0xd1,pcVar10);
            testing::internal::AssertHelper::operator=(&local_118,(Message *)&local_148);
            goto LAB_00925d71;
          }
          if (local_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_120,local_120);
          }
        }
        iVar9 = iVar9 + -1;
        uVar6 = uVar7;
      } while (iVar9 != 0);
      protobuf::internal::ThreadSafeArena::~ThreadSafeArena((ThreadSafeArena *)local_d8);
      if (local_110.data_ != (AssertHelperData *)local_100) {
        operator_delete(local_110.data_,local_100._0_8_ + 1);
      }
    }
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)(local_100 + 0x10));
    if (local_e8 != '\x01') {
      return;
    }
  }
  testing::Message::Message((Message *)&local_d8[0]._M_allocated_capacity);
  testing::internal::AssertHelper::AssertHelper
            (&local_110,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
             ,0xe1,
             "Expected: CheckAllocationSizes<RepeatedField<absl::Cord>>() doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
            );
  testing::internal::AssertHelper::operator=
            (&local_110,(Message *)&local_d8[0]._M_allocated_capacity);
  testing::internal::AssertHelper::~AssertHelper(&local_110);
  if ((long *)local_d8[0]._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_d8[0]._0_8_ + 8))();
  }
  return;
}

Assistant:

TEST(RepeatedField, ArenaAllocationSizesMatchExpectedValues) {
  // RepeatedField guarantees that in 64-bit mode we never allocate anything
  // smaller than 16 bytes from an arena.
  // This is important to avoid a branch in the reallocation path.
  // This is also important because allocating anything less would be wasting
  // memory.
  // If the allocation size is wrong, ReturnArrayMemory will ABSL_DCHECK.
  EXPECT_NO_FATAL_FAILURE(CheckAllocationSizes<RepeatedField<bool>>());
  EXPECT_NO_FATAL_FAILURE(CheckAllocationSizes<RepeatedField<uint32_t>>());
  EXPECT_NO_FATAL_FAILURE(CheckAllocationSizes<RepeatedField<uint64_t>>());
  EXPECT_NO_FATAL_FAILURE(CheckAllocationSizes<RepeatedField<absl::Cord>>());
}